

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O1

void __thiscall
cppjieba::HMMSegment::Cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  pointer *ppWVar1;
  iterator __position;
  const_iterator pRVar2;
  const_iterator end_00;
  WordRange wr;
  WordRange local_40;
  
  pRVar2 = begin;
  if (begin != end) {
    end_00 = begin;
    do {
      if (end_00->rune < 0x80) {
        if (begin != end_00) {
          InternalCut(this,begin,end_00,res);
        }
        begin = end_00;
        if ((end_00->rune & 0xffffffdf) - 0x41 < 0x1a) {
          pRVar2 = end_00 + 1;
          do {
            begin = pRVar2;
            if (begin == end) break;
            pRVar2 = begin + 1;
          } while ((begin->rune - 0x30 < 10) || ((begin->rune & 0xffffffdf) - 0x41 < 0x1a));
        }
        if (begin == end_00) {
          pRVar2 = end_00;
          if (end_00->rune - 0x30 < 10) {
            do {
              pRVar2 = pRVar2 + 1;
              if (pRVar2 == end) break;
            } while (pRVar2->rune == 0x2e || pRVar2->rune - 0x30 < 10);
          }
          begin = pRVar2 + 1;
          if (pRVar2 != end_00) {
            begin = pRVar2;
          }
        }
        local_40.right = begin + -1;
        __position._M_current =
             (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        pRVar2 = begin;
        local_40.left = end_00;
        if (__position._M_current ==
            (res->super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>>::
          _M_realloc_insert<cppjieba::WordRange_const&>
                    ((vector<cppjieba::WordRange,std::allocator<cppjieba::WordRange>> *)res,
                     __position,&local_40);
        }
        else {
          (__position._M_current)->left = end_00;
          (__position._M_current)->right = local_40.right;
          ppWVar1 = &(res->
                     super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + 1;
        }
      }
      else {
        pRVar2 = end_00 + 1;
      }
      end_00 = pRVar2;
    } while (pRVar2 != end);
  }
  if (begin != pRVar2) {
    InternalCut(this,begin,pRVar2,res);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res) const {
    RuneStrArray::const_iterator left = begin;
    RuneStrArray::const_iterator right = begin;
    while (right != end) {
      if (right->rune < 0x80) {
        if (left != right) {
          InternalCut(left, right, res);
        }
        left = right;
        do {
          right = SequentialLetterRule(left, end);
          if (right != left) {
            break;
          }
          right = NumbersRule(left, end);
          if (right != left) {
            break;
          }
          right ++;
        } while (false);
        WordRange wr(left, right - 1);
        res.push_back(wr);
        left = right;
      } else {
        right++;
      }
    }
    if (left != right) {
      InternalCut(left, right, res);
    }
  }